

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::FieldDescriptorProto::_InternalParse
          (FieldDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  int number;
  FieldOptions *msg;
  char cVar4;
  uint32 uVar5;
  uint uVar6;
  Arena *pAVar7;
  string *s;
  UnknownFieldSet *this_01;
  uint uVar8;
  ArenaStringPtr *this_02;
  byte *pbVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_bool> pVar12;
  
  this_00 = &this->_internal_metadata_;
  uVar8 = 0;
LAB_00171b93:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00172025;
      pVar12 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00172025;
    }
    bVar1 = *ptr;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)((byte *)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,uVar5);
        if (pVar10.first == (char *)0x0) goto LAB_00172022;
      }
      else {
        pVar10.second = uVar5;
        pVar10.first = (char *)((byte *)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    pbVar9 = (byte *)pVar10.first;
    uVar6 = pVar10.second;
    cVar4 = (char)pVar10.second;
    switch((uint)(pVar10._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar4 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      s = (this->name_).ptr_;
      this_02 = &this->name_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_00171e13:
        internal::ArenaStringPtr::CreateInstance
                  (this_02,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_02->ptr_;
      }
LAB_00171e2d:
      ptr = internal::InlineGreedyStringParser(s,(char *)pbVar9,ctx);
      goto LAB_00171e3b;
    case 2:
      if (cVar4 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->extendee_).ptr_;
        this_02 = &this->extendee_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00171e13;
        goto LAB_00171e2d;
      }
      break;
    case 3:
      if (cVar4 == '\x18') {
        uVar8 = uVar8 | 0x40;
        bVar1 = *pbVar9;
        uVar6 = (uint)bVar1;
        ptr = (char *)(pbVar9 + 1);
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)pbVar9,uVar6);
            ptr = pVar11.first;
            this->number_ = (int32)pVar11.second;
            goto LAB_00171e3b;
          }
          ptr = (char *)(pbVar9 + 2);
        }
        this->number_ = uVar6;
        goto LAB_00171b93;
      }
      break;
    case 4:
      if (cVar4 == ' ') {
        bVar1 = *pbVar9;
        pVar11.second = (long)(char)bVar1;
        pVar11.first = (char *)(pbVar9 + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = pbVar9[1];
          uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)pbVar9,uVar5);
            if (pVar11.first == (char *)0x0) {
LAB_0017203b:
              ptr = (char *)0x0;
              goto LAB_00172025;
            }
          }
          else {
            pVar11.second._0_4_ = uVar5;
            pVar11.first = (char *)(pbVar9 + 2);
            pVar11.second._4_4_ = 0;
          }
        }
        ptr = pVar11.first;
        if ((int)pVar11.second - 1U < 3) {
          pbVar9 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar9 = *pbVar9 | 1;
          this->label_ = (int)pVar11.second;
        }
        else {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          number = 4;
LAB_00171fe1:
          ptr = pVar11.first;
          UnknownFieldSet::AddVarint(this_01,number,pVar11.second);
        }
        goto LAB_00171b93;
      }
      break;
    case 5:
      if (cVar4 == '(') {
        bVar1 = *pbVar9;
        pVar11.second = (long)(char)bVar1;
        pVar11.first = (char *)(pbVar9 + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = pbVar9[1];
          uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)pbVar9,uVar5);
            if (pVar11.first == (char *)0x0) goto LAB_0017203b;
          }
          else {
            pVar11.second._0_4_ = uVar5;
            pVar11.first = (char *)(pbVar9 + 2);
            pVar11.second._4_4_ = 0;
          }
        }
        ptr = pVar11.first;
        if (0x11 < (int)pVar11.second - 1U) {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          number = 5;
          goto LAB_00171fe1;
        }
        pbVar9 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar9 = *pbVar9 | 2;
        this->type_ = (int)pVar11.second;
        goto LAB_00171b93;
      }
      break;
    case 6:
      if (cVar4 == '2') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->type_name_).ptr_;
        this_02 = &this->type_name_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00171e13;
        goto LAB_00171e2d;
      }
      break;
    case 7:
      if (cVar4 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->default_value_).ptr_;
        this_02 = &this->default_value_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00171e13;
        goto LAB_00171e2d;
      }
      break;
    case 8:
      if (cVar4 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        msg = this->options_;
        if (msg == (FieldOptions *)0x0) {
          pAVar7 = (Arena *)(this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            ).ptr_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          msg = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar7);
          this->options_ = msg;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldOptions>
                        (ctx,msg,(char *)pbVar9);
        goto LAB_00171e3b;
      }
      break;
    case 9:
      if (cVar4 == 'H') {
        uVar8 = uVar8 | 0x80;
        bVar1 = *pbVar9;
        uVar6 = (uint)bVar1;
        ptr = (char *)(pbVar9 + 1);
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)pbVar9,uVar6);
            ptr = pVar11.first;
            this->oneof_index_ = (int32)pVar11.second;
            goto LAB_00171e3b;
          }
          ptr = (char *)(pbVar9 + 2);
        }
        this->oneof_index_ = uVar6;
        goto LAB_00171b93;
      }
      break;
    case 10:
      if (cVar4 == 'R') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->json_name_).ptr_;
        this_02 = &this->json_name_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00171e13;
        goto LAB_00171e2d;
      }
    }
    if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
      ptr = (char *)pbVar9;
      goto LAB_00172025;
    }
    ptr = internal::UnknownFieldParse(uVar6,this_00,(char *)pbVar9,ctx);
LAB_00171e3b:
    if ((byte *)ptr == (byte *)0x0) {
LAB_00172022:
      ptr = (char *)(byte *)0x0;
LAB_00172025:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* FieldDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string extendee = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_extendee(), ptr, ctx, "google.protobuf.FieldDescriptorProto.extendee");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(val))) {
            _internal_set_label(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(4, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(val))) {
            _internal_set_type(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional string type_name = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_type_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.type_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string default_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_default_value(), ptr, ctx, "google.protobuf.FieldDescriptorProto.default_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 oneof_index = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          _Internal::set_has_oneof_index(&has_bits);
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_json_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.json_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}